

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O1

string * __thiscall
libtorrent::print_entry_abi_cxx11_
          (string *__return_storage_ptr__,libtorrent *this,bdecode_node *e,bool single_line,
          int indent)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int64_t iVar5;
  size_t sVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  uint uVar8;
  undefined7 in_register_00000009;
  byte bVar9;
  string_view str_00;
  string_view str_01;
  string ret;
  char str [100];
  char indent_str [200];
  pointer local_1c0;
  size_type local_1b8;
  char local_1b0;
  uint7 uStack_1af;
  undefined8 uStack_1a8;
  char *local_1a0;
  string local_198;
  string *local_178;
  char *local_170;
  undefined1 local_168 [16];
  pointer local_158;
  pointer local_148;
  char local_f8 [199];
  undefined1 local_31;
  
  local_1a0 = local_f8;
  memset(local_1a0,0x20,200);
  local_f8[0] = ',';
  local_f8[1] = '\n';
  local_31 = 0;
  if ((uint)CONCAT71(in_register_00000009,single_line) < 0xc5) {
    local_f8[(CONCAT71(in_register_00000009,single_line) & 0xffffffff) + 2] = '\0';
  }
  local_1c0 = &local_1b0;
  local_1b8 = 0;
  local_1b0 = '\0';
  lVar4 = (long)*(int *)(this + 0x2c);
  if (lVar4 == -1) {
    uVar8 = 0;
  }
  else {
    uVar8 = *(uint *)(*(long *)(this + 0x18) + lVar4 * 8) >> 0x1d;
  }
  if (4 < uVar8) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = (ulong)uStack_1af << 8;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_1a8;
    __return_storage_ptr__->_M_string_length = 0;
    goto LAB_0018fb15;
  }
  switch(uVar8) {
  case 0:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"none","");
    goto LAB_0018fb1a;
  case 1:
    std::__cxx11::string::push_back((char)&local_1c0);
    local_178 = __return_storage_ptr__;
    iVar2 = anon_unknown_10::line_longer_than((bdecode_node *)this,200);
    bVar9 = iVar2 != -1 | (byte)e;
    if (bVar9 == 0) {
      std::__cxx11::string::append((char *)&local_1c0);
    }
    iVar2 = bdecode_node::dict_size((bdecode_node *)this);
    if (0 < iVar2) {
      if (bVar9 != 0) {
        local_1a0 = ", ";
      }
      iVar2 = 0;
      do {
        if (iVar2 == 0 && bVar9 == 1) {
          std::__cxx11::string::push_back((char)(anon_unknown_10 *)&local_1c0);
        }
        bdecode_node::dict_at
                  ((pair<boost::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node>
                    *)local_168,(bdecode_node *)this,iVar2);
        str_01.len_ = 1;
        str_01.ptr_ = (char *)local_168._8_8_;
        anon_unknown_10::print_string
                  ((anon_unknown_10 *)&local_1c0,(string *)local_168._0_8_,str_01,SUB41(indent,0));
        std::__cxx11::string::append((char *)&local_1c0);
        print_entry_abi_cxx11_
                  (&local_198,(libtorrent *)&local_158,(bdecode_node *)((ulong)e & 0xff),
                   (bool)(single_line + '\x02'),indent);
        std::__cxx11::string::_M_append((char *)&local_1c0,(ulong)local_198._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        bdecode_node::dict_size((bdecode_node *)this);
        std::__cxx11::string::append((char *)&local_1c0);
        if (local_158 != (pointer)0x0) {
          operator_delete(local_158,(long)local_148 - (long)local_158);
        }
        iVar2 = iVar2 + 1;
        iVar3 = bdecode_node::dict_size((bdecode_node *)this);
      } while (iVar2 < iVar3);
    }
    std::__cxx11::string::push_back((char)&local_1c0);
    break;
  case 2:
    std::__cxx11::string::push_back((char)&local_1c0);
    local_178 = __return_storage_ptr__;
    iVar2 = anon_unknown_10::line_longer_than((bdecode_node *)this,200);
    bVar9 = iVar2 != -1 | (byte)e;
    if (bVar9 == 0) {
      std::__cxx11::string::append((char *)&local_1c0);
    }
    local_170 = local_f8 + 1;
    iVar2 = bdecode_node::list_size((bdecode_node *)this);
    if (0 < iVar2) {
      if (bVar9 != 0) {
        local_170 = " ";
        local_1a0 = ", ";
      }
      iVar2 = 0;
      do {
        if (iVar2 == 0 && bVar9 == 1) {
          std::__cxx11::string::push_back((char)&local_1c0);
        }
        bdecode_node::list_at((bdecode_node *)local_168,(bdecode_node *)this,iVar2);
        print_entry_abi_cxx11_
                  (&local_198,(libtorrent *)local_168,(bdecode_node *)((ulong)e & 0xff),
                   (bool)(single_line + '\x02'),indent);
        std::__cxx11::string::_M_append((char *)&local_1c0,(ulong)local_198._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        if ((string *)local_168._0_8_ != (string *)0x0) {
          operator_delete((void *)local_168._0_8_,(long)local_158 - local_168._0_8_);
        }
        bdecode_node::list_size((bdecode_node *)this);
        std::__cxx11::string::append((char *)&local_1c0);
        iVar2 = iVar2 + 1;
        iVar3 = bdecode_node::list_size((bdecode_node *)this);
      } while (iVar2 < iVar3);
    }
    std::__cxx11::string::push_back((char)&local_1c0);
    break;
  case 3:
    uVar1 = *(ulong *)(*(long *)(this + 0x18) + lVar4 * 8);
    uVar8 = (uint)uVar1 & 0x1fffffff;
    str_00.ptr_ = (char *)(long)(int)((((*(uint *)(*(long *)(this + 0x18) + 8 + lVar4 * 8) &
                                        0x1fffffff) - uVar8) - (uint)(uVar1 >> 0x3d)) + -2);
    str_00.len_ = (ulong)e & 0xff;
    anon_unknown_10::print_string
              ((anon_unknown_10 *)&local_1c0,
               (string *)((uVar1 >> 0x3d) + (ulong)uVar8 + *(long *)(this + 0x20) + 2),str_00,
               SUB41(indent,0));
    paVar7 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar7;
    goto LAB_0018fabb;
  case 4:
    iVar5 = bdecode_node::int_value((bdecode_node *)this);
    snprintf(local_168,100,"%ld",iVar5);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar6 = strlen(local_168);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,local_168,local_168 + sVar6);
    goto LAB_0018fb1a;
  }
  paVar7 = &local_178->field_2;
  (local_178->_M_dataplus)._M_p = (pointer)paVar7;
  __return_storage_ptr__ = local_178;
LAB_0018fabb:
  if (local_1c0 == &local_1b0) {
    paVar7->_M_allocated_capacity = CONCAT71(uStack_1af,local_1b0);
    *(undefined8 *)((long)paVar7 + 8) = uStack_1a8;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_1c0;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_1af,local_1b0);
  }
  __return_storage_ptr__->_M_string_length = local_1b8;
LAB_0018fb15:
  local_1c0 = &local_1b0;
  local_1b8 = 0;
  local_1b0 = '\0';
LAB_0018fb1a:
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,CONCAT71(uStack_1af,local_1b0) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string print_entry(bdecode_node const& e
		, bool single_line, int indent)
	{
		char indent_str[200];
		using std::memset;
		memset(indent_str, ' ', 200);
		indent_str[0] = ',';
		indent_str[1] = '\n';
		indent_str[199] = 0;
		if (indent < 197 && indent >= 0) indent_str[indent + 2] = 0;
		std::string ret;
		switch (e.type())
		{
			case bdecode_node::none_t: return "none";
			case bdecode_node::int_t:
			{
				char str[100];
				std::snprintf(str, sizeof(str), "%" PRId64, e.int_value());
				return str;
			}
			case bdecode_node::string_t:
			{
				print_string(ret, e.string_value(), single_line);
				return ret;
			}
			case bdecode_node::list_t:
			{
				ret += '[';
				bool one_liner = line_longer_than(e, 200) != -1 || single_line;

				if (!one_liner) ret += indent_str + 1;
				for (int i = 0; i < e.list_size(); ++i)
				{
					if (i == 0 && one_liner) ret += ' ';
					ret += print_entry(e.list_at(i), single_line, indent + 2);
					if (i < e.list_size() - 1) ret += (one_liner ? ", " : indent_str);
					else ret += (one_liner ? " " : indent_str + 1);
				}
				ret += ']';
				return ret;
			}
			case bdecode_node::dict_t:
			{
				ret += '{';
				bool one_liner = line_longer_than(e, 200) != -1 || single_line;

				if (!one_liner) ret += indent_str + 1;
				for (int i = 0; i < e.dict_size(); ++i)
				{
					if (i == 0 && one_liner) ret += ' ';
					std::pair<string_view, bdecode_node> ent = e.dict_at(i);
					print_string(ret, ent.first, true);
					ret += ": ";
					ret += print_entry(ent.second, single_line, indent + 2);
					if (i < e.dict_size() - 1) ret += (one_liner ? ", " : indent_str);
					else ret += (one_liner ? " " : indent_str + 1);
				}
				ret += '}';
				return ret;
			}
		}
		return ret;
	}